

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UCharCharacterIterator::current32(UCharCharacterIterator *this)

{
  uint local_1c;
  uint16_t __c2;
  UChar32 c;
  UCharCharacterIterator *this_local;
  
  if (((this->super_CharacterIterator).pos < (this->super_CharacterIterator).begin) ||
     ((this->super_CharacterIterator).end <= (this->super_CharacterIterator).pos)) {
    this_local._4_4_ = 0xffff;
  }
  else {
    local_1c = (uint)(ushort)this->text[(this->super_CharacterIterator).pos];
    if ((local_1c & 0xfffff800) == 0xd800) {
      if ((this->text[(this->super_CharacterIterator).pos] & 0x400U) == 0) {
        if (((this->super_CharacterIterator).pos + 1 != (this->super_CharacterIterator).end) &&
           ((this->text[(this->super_CharacterIterator).pos + 1] & 0xfc00U) == 0xdc00)) {
          local_1c = local_1c * 0x400 +
                     (uint)(ushort)this->text[(this->super_CharacterIterator).pos + 1] + 0xfca02400;
        }
      }
      else if (((this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos) &&
              ((this->text[(this->super_CharacterIterator).pos + -1] & 0xfc00U) == 0xd800)) {
        local_1c = (uint)(ushort)this->text[(this->super_CharacterIterator).pos + -1] * 0x400 +
                   local_1c + 0xfca02400;
      }
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UCharCharacterIterator::current32() const {
    if (pos >= begin && pos < end) {
        UChar32 c;
        U16_GET(text, begin, pos, end, c);
        return c;
    } else {
        return DONE;
    }
}